

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_ReserveLessThanDouble_Test::
RepeatedPtrFieldTest_ReserveLessThanDouble_Test
          (RepeatedPtrFieldTest_ReserveLessThanDouble_Test *this)

{
  RepeatedPtrFieldTest_ReserveLessThanDouble_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__RepeatedPtrFieldTest_ReserveLessThanDouble_Test_029e9e90;
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, ReserveLessThanDouble) {
  RepeatedPtrField<std::string> field;
  field.Reserve(20);

  int capacity = field.Capacity();
  // Grow by 1.5x
  field.Reserve(capacity + (capacity >> 2));

  EXPECT_LE(2 * capacity, ReservedSpace(&field));
}